

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void variance_double_suite::test_same(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  double absolute_tolerance;
  double *in_stack_fffffffffffffef8;
  double local_f8;
  value_type local_f0;
  value_type local_e8;
  double local_d8;
  value_type local_d0;
  value_type local_c8;
  double local_b8;
  value_type local_b0;
  value_type local_a8;
  double local_98;
  value_type local_90;
  value_type local_88;
  double local_78;
  value_type local_70;
  value_type local_68;
  double local_58;
  value_type local_50;
  undefined1 local_48 [8];
  moment_variance<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_(trial::online::with)2> *)local_48,0.125,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1.0);
  local_50 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_58 = 1.0;
  local_68 = filter.sum.variance;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x14d,0x11192f,(char *)&local_50,&local_58,in_stack_fffffffffffffef8,
             predicate_04);
  local_70 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_78 = 0.0;
  local_88 = filter.sum.variance;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x14e,0x11192f,(char *)&local_70,&local_78,in_stack_fffffffffffffef8,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1.0);
  local_90 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_98 = 1.0;
  local_a8 = filter.sum.variance;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x150,0x11192f,(char *)&local_90,&local_98,in_stack_fffffffffffffef8,
             predicate_02);
  local_b0 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_b8 = 0.0;
  local_c8 = filter.sum.variance;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x151,0x11192f,(char *)&local_b0,&local_b8,in_stack_fffffffffffffef8,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1.0);
  local_d0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_d8 = 1.0;
  local_e8 = filter.sum.variance;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x153,0x11192f,(char *)&local_d0,&local_d8,in_stack_fffffffffffffef8,
             predicate_00);
  local_f0 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_f8 = 0.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x154,0x11192f,(char *)&local_f0,&local_f8,(double *)filter.sum.variance,
             predicate);
  return;
}

Assistant:

void test_same()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
}